

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_location.cpp
# Opt level: O1

Am_Wrapper * __thiscall Am_Inter_Location_Data::Make_Unique(Am_Inter_Location_Data *this)

{
  uint uVar1;
  Am_Inter_Location_Data *this_00;
  
  uVar1 = (this->super_Am_Wrapper).refs;
  this_00 = this;
  if (uVar1 != 1) {
    uVar1 = uVar1 - 1;
    (this->super_Am_Wrapper).refs = uVar1;
    if (uVar1 == 0) {
      (*(this->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[4])(this);
    }
    this_00 = (Am_Inter_Location_Data *)operator_new(0x40);
    Am_Inter_Location_Data(this_00,this);
  }
  return &this_00->super_Am_Wrapper;
}

Assistant:

void
Am_Inter_Location_Data::Print(std::ostream &os) const
{
  os << "(";
  if (as_line) {
    os << data.line.x1 << "," << data.line.y1 << ").(" << data.line.x2 << ","
       << data.line.y2 << ")";
  } else if (growing)
    os << data.rect.left << "," << data.rect.top << "," << data.rect.width
       << "," << data.rect.height << ")";
  else
    os << data.rect.left << "," << data.rect.top << ")";
  os << " w.r.t. " << ref_obj;
}